

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O1

_Bool oonf_layer2_data_set_int64
                (oonf_layer2_data *l2data,oonf_layer2_origin *origin,oonf_layer2_metadata *meta,
                int64_t integer,uint64_t scaling)

{
  ulong uVar1;
  _Bool _Var2;
  oonf_layer2_value local_18;
  
  local_18.integer = 0;
  local_18._8_8_ = 0;
  local_18._16_8_ = 0;
  if (((meta == (oonf_layer2_metadata *)0x0) &&
      (meta = l2data->_meta, meta == (oonf_layer2_metadata *)0x0)) &&
     ((log_global_mask[_oonf_layer2_subsystem.logging] & 8) != 0)) {
    oonf_log(LOG_SEVERITY_ASSERT,_oonf_layer2_subsystem.logging,"src/base/oonf_layer2.c",0x176,
             (void *)0x0,0,"Tried to set layer2 data without metadata (origin: %s)",origin->name);
    abort();
  }
  local_18.integer = integer;
  if (scaling != 0) {
    uVar1 = meta->scaling;
    if (uVar1 < scaling) {
      local_18.integer = integer / (scaling / uVar1);
    }
    else {
      local_18.integer = (uVar1 / scaling) * integer;
    }
  }
  _Var2 = oonf_layer2_data_set(l2data,origin,meta,&local_18);
  return _Var2;
}

Assistant:

bool
oonf_layer2_data_set_int64(struct oonf_layer2_data *l2data, const struct oonf_layer2_origin *origin,
    const struct oonf_layer2_metadata *meta, int64_t integer, uint64_t scaling) {
  union oonf_layer2_value value = { 0 };

  if (meta == NULL) {
    OONF_ASSERT(l2data->_meta != NULL, LOG_LAYER2, "Tried to set layer2 data without metadata (origin: %s)", origin->name);
    meta = l2data->_meta;
  }
  if (scaling == 0) {
    value.integer = integer;
  }
  else if (scaling > meta->scaling) {
    value.integer = integer / (scaling / meta->scaling);
  }
  else {
    value.integer = integer * (meta->scaling / scaling);
  }

  return oonf_layer2_data_set(l2data, origin, meta, &value);
}